

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

bool __thiscall cmQtAutoGenInitializer::InitRcc(cmQtAutoGenInitializer *this)

{
  bool bVar1;
  long lVar2;
  string stdOut;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"rcc",&local_51);
  bVar1 = GetQtExecutable(this,&(this->Rcc).super_GenVarsT,&local_30,false,&local_50);
  std::__cxx11::string::~string((string *)&local_30);
  if ((bVar1) && ((this->QtVersion).Major - 5 < 2)) {
    lVar2 = std::__cxx11::string::find((char *)&local_50,0x41d8ad);
    if (lVar2 == -1) {
      lVar2 = std::__cxx11::string::find((char *)&local_50,0x41d8ae);
      if (lVar2 != -1) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const(&)[6]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   &(this->Rcc).ListOptions,(char (*) [6])0x41d8ae);
      }
    }
    else {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const(&)[7]>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &(this->Rcc).ListOptions,(char (*) [7])"--list");
    }
  }
  std::__cxx11::string::~string((string *)&local_50);
  return bVar1;
}

Assistant:

bool cmQtAutoGenInitializer::InitRcc()
{
  // Rcc executable
  {
    std::string stdOut;
    if (!this->GetQtExecutable(this->Rcc, "rcc", false, &stdOut)) {
      return false;
    }
    // Evaluate test output
    if (this->QtVersion.Major == 5 || this->QtVersion.Major == 6) {
      if (stdOut.find("--list") != std::string::npos) {
        this->Rcc.ListOptions.emplace_back("--list");
      } else if (stdOut.find("-list") != std::string::npos) {
        this->Rcc.ListOptions.emplace_back("-list");
      }
    }
  }

  return true;
}